

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Scaler::Scaler(Scaler *this)

{
  Scaler *pSVar1;
  Scaler *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Scaler_00d5d948;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->shiftvalue_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->scalevalue_);
  pSVar1 = internal_default_instance();
  if (this != pSVar1) {
    protobuf_Scaler_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

Scaler::Scaler()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Scaler_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Scaler)
}